

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

llama_sampler *
llama_sampler_init_dry
          (llama_vocab *vocab,int32_t context_size,float dry_multiplier,float dry_base,
          int32_t dry_allowed_length,int32_t dry_penalty_last_n,char **seq_breakers,
          size_t num_breakers)

{
  int *piVar1;
  size_t sVar2;
  ulong uVar3;
  ring_buffer<int> *this;
  value_type_conflict3 *__value;
  int in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  long in_R8;
  ulong in_R9;
  float in_XMM0_Da;
  float in_XMM1_Da;
  int in_stack_0000004c;
  unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *in_stack_00000050;
  string *in_stack_00000058;
  llama_vocab *in_stack_00000060;
  string sequence_break;
  size_t i;
  bool dry_enabled;
  int MAX_SEQ_LEN;
  int MAX_CHAR_LEN;
  unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  processed_breakers;
  int32_t effective_dry_penalty_last_n;
  unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *in_stack_fffffffffffffed8;
  unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *in_stack_fffffffffffffee0;
  llama_sampler_i *iface;
  allocator_type *in_stack_fffffffffffffee8;
  undefined1 *__n;
  size_t *this_00;
  size_t *__s;
  allocator<char> *in_stack_ffffffffffffff10;
  char *__s_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  bool local_d5;
  int local_d4;
  bool local_ce;
  undefined1 local_cd;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined1 local_c1 [49];
  ulong local_90;
  bool local_81;
  undefined4 local_80;
  undefined4 local_7c;
  int local_40;
  int local_3c;
  ulong local_38;
  long local_30;
  int local_24;
  undefined4 local_20;
  float local_1c;
  float local_18;
  int local_14;
  llama_sampler *local_8;
  
  local_d4 = in_ESI;
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_EDX;
  local_1c = in_XMM1_Da;
  local_18 = in_XMM0_Da;
  local_14 = in_ESI;
  if (in_ECX != -1) {
    local_40 = 0;
    piVar1 = std::max<int>(&local_24,&local_40);
    local_d4 = *piVar1;
  }
  local_3c = local_d4;
  std::
  unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::unordered_multimap
            ((unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)0x51826b);
  local_7c = 0x28;
  local_80 = 0x14;
  local_d5 = false;
  if (((local_18 != 0.0) || (NAN(local_18))) && (local_d5 = false, 1.0 <= local_1c)) {
    local_d5 = local_24 != 0;
  }
  local_81 = local_d5;
  if (((local_d5 != false) && (local_30 != 0)) && (local_38 != 0)) {
    for (local_90 = 0; local_90 < local_38; local_90 = local_90 + 1) {
      if ((*(long *)(local_30 + local_90 * 8) == 0) ||
         (sVar2 = strlen(*(char **)(local_30 + local_90 * 8)), sVar2 == 0)) {
        llama_log_internal(GGML_LOG_LEVEL_WARN,
                           "skipping null or empty DRY sequence breaker at index %zu\n",local_90);
      }
      else {
        __s_00 = *(char **)(local_30 + local_90 * 8);
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this_01,__s_00,in_stack_ffffffffffffff10)
        ;
        std::allocator<char>::~allocator((allocator<char> *)local_c1);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          uVar3 = std::__cxx11::string::size();
          if (0x28 < uVar3) {
            llama_log_internal(GGML_LOG_LEVEL_WARN,
                               "truncating DRY sequence breaker to %d characters\n",0x28);
            std::__cxx11::string::resize((ulong)(local_c1 + 1));
          }
          get_overlapping_token_sequences
                    (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_0000004c);
          local_c8 = 0;
        }
        else {
          llama_log_internal(GGML_LOG_LEVEL_WARN,"skipping empty DRY sequence breaker\n");
          local_c8 = 4;
        }
        std::__cxx11::string::~string((string *)(local_c1 + 1));
      }
    }
  }
  this = (ring_buffer<int> *)operator_new(0xd8);
  *(int *)&this->capacity = local_14;
  *(float *)((long)&this->capacity + 4) = local_18;
  *(float *)&this->sz = local_1c;
  *(undefined4 *)((long)&this->sz + 4) = local_20;
  *(int *)&this->first = local_24;
  this_00 = &this->pos;
  std::
  unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::unordered_multimap(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  __s = &this[1].pos;
  local_ce = (local_81 & 1U) == 0;
  if (local_ce) {
    memset(__s,0,0x18);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x5185da);
  }
  else {
    __value = (value_type_conflict3 *)(long)local_3c;
    local_cc = 0;
    __n = &local_cd;
    std::allocator<int>::allocator((allocator<int> *)0x51859d);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)this_00,(size_type)__n,__value,
               in_stack_fffffffffffffee8);
  }
  local_ce = !local_ce;
  iface = (llama_sampler_i *)
          &this[1].data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  memset(iface,0,0x38);
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)0x5185fe);
  if ((local_81 & 1U) == 0) {
    ring_buffer<int>::ring_buffer(this,(size_t)__s);
  }
  else {
    ring_buffer<int>::ring_buffer(this,(size_t)__s);
  }
  local_8 = llama_sampler_init(iface,in_stack_fffffffffffffed8);
  if (local_ce) {
    std::allocator<int>::~allocator((allocator<int> *)0x518680);
  }
  local_c8 = 1;
  std::
  unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~unordered_multimap
            ((unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)0x518695);
  return local_8;
}

Assistant:

struct llama_sampler * llama_sampler_init_dry(const struct llama_vocab * vocab, int32_t context_size, float dry_multiplier, float dry_base, int32_t dry_allowed_length, int32_t dry_penalty_last_n, const char** seq_breakers, size_t num_breakers) {
    int32_t effective_dry_penalty_last_n = (dry_penalty_last_n == -1) ? context_size : std::max(dry_penalty_last_n, 0);
    std::unordered_multimap<llama_token, std::vector<llama_token>> processed_breakers;
    const int MAX_CHAR_LEN = 40;
    const int MAX_SEQ_LEN = 20;

    const bool dry_enabled = (dry_multiplier != 0.0f && dry_base >= 1.0f && dry_penalty_last_n != 0);

    if (dry_enabled && seq_breakers != nullptr && num_breakers > 0) {
        // Process sequence breakers
        for (size_t i = 0; i < num_breakers; ++i) {
            if (seq_breakers[i] == nullptr || std::strlen(seq_breakers[i]) == 0) {
                LLAMA_LOG_WARN("skipping null or empty DRY sequence breaker at index %zu\n", i);
                continue;
            }

            std::string sequence_break(seq_breakers[i]);
            if (sequence_break.empty()) {
                LLAMA_LOG_WARN("skipping empty DRY sequence breaker\n");
                continue;
            }

            if (sequence_break.size() > MAX_CHAR_LEN) {
                LLAMA_LOG_WARN("truncating DRY sequence breaker to %d characters\n", MAX_CHAR_LEN);
                sequence_break.resize(MAX_CHAR_LEN);
            }

            get_overlapping_token_sequences(*vocab, sequence_break, processed_breakers, MAX_SEQ_LEN);
        }
    }

    return llama_sampler_init(
        /* .iface = */ &llama_sampler_dry_i,
        /* .ctx   = */ new llama_sampler_dry {
            /* .total_context_size     = */ context_size,
            /* .dry_multiplier         = */ dry_multiplier,
            /* .dry_base               = */ dry_base,
            /* .dry_allowed_length     = */ dry_allowed_length,
            /* .dry_penalty_last_n     = */ dry_penalty_last_n,
            /* .dry_processed_breakers = */ std::move(processed_breakers),
            /* .dry_repeat_count       = */ dry_enabled ? std::vector<int>(effective_dry_penalty_last_n, 0) : std::vector<int>{},
            /* .dry_max_token_repeat   = */ {},
            /* .last_tokens            = */ dry_enabled ? ring_buffer<llama_token>(effective_dry_penalty_last_n) : ring_buffer<llama_token>(0),
        }
    );
}